

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
                  *v)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *v_00;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *v_01;
  type_by_index_t<2UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *v_02;
  type_by_index_t<3UL,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *v_03;
  tuple<Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *v_local;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
  *this_local;
  
  v_00 = get<0ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                   (v);
  tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,false>::operator=
            ((tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,false> *)this,
             v_00);
  v_01 = get<1ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                   (v);
  tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,false> *)
             (this + 0x10),v_01);
  v_02 = get<2ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                   (v);
  tuple_value<2ul,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,false>::operator=
            ((tuple_value<2ul,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,false> *)
             (this + 0x20),v_02);
  v_03 = get<3ul,Fixpp::FieldRef<Fixpp::TagT<32u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<17u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<31u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>>
                   (v);
  tuple_value<3ul,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>,false>::operator=
            ((tuple_value<3ul,Fixpp::FieldRef<Fixpp::TagT<29u,Fixpp::Type::Char>>,false> *)
             (this + 0x30),v_03);
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_Fixpp::FieldRef<Fixpp::TagT<32U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<17U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<31U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<29U,_Fixpp::Type::Char>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }